

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

char * ImAtoi<int>(char *src,int *output)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  char cVar4;
  int iVar5;
  
  uVar1 = (ulong)(*src == '-');
  pcVar2 = src + (src[uVar1] == '+') + uVar1;
  cVar4 = src[(src[uVar1] == '+') + uVar1];
  iVar3 = 0;
  if ((byte)(cVar4 - 0x30U) < 10) {
    iVar3 = 0;
    do {
      iVar3 = (uint)(byte)(cVar4 - 0x30) + iVar3 * 10;
      cVar4 = pcVar2[1];
      pcVar2 = pcVar2 + 1;
    } while ((byte)(cVar4 - 0x30U) < 10);
  }
  iVar5 = -iVar3;
  if (*src != '-') {
    iVar5 = iVar3;
  }
  *output = iVar5;
  return pcVar2;
}

Assistant:

static const char* ImAtoi(const char* src, TYPE* output)
{
    int negative = 0;
    if (*src == '-') { negative = 1; src++; }
    if (*src == '+') { src++; }
    TYPE v = 0;
    while (*src >= '0' && *src <= '9')
        v = (v * 10) + (*src++ - '0');
    *output = negative ? -v : v;
    return src;
}